

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O3

int IterativelyApplyExorLink3(char fDistEnable)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  s_Dist = DIST3;
  uVar2 = (uint)(byte)fDistEnable;
  s_fDistEnable2 = uVar2 & 1;
  s_fDistEnable3 = uVar2 & 2;
  s_fDistEnable4 = uVar2 & 4;
  s_cEnquequed = ((s_Que[1].PosIn - s_Que[1].PosOut) + s_nPosAlloc) % s_nPosAlloc;
  s_cAttempts = 0;
  s_cReshapes = 0;
  s_nCubesBefore = g_CoverInfo.nCubesInUse;
  iVar1 = IteratorCubePairStart(DIST3,&s_pC1,&s_pC2);
joined_r0x0034febc:
  if (iVar1 == 0) {
    if (g_CoverInfo.Verbosity == 2) {
      printf("ExLink-%d",3);
      printf(": Que= %5d",(ulong)(uint)s_cEnquequed);
      printf("  Att= %4d",(ulong)(uint)s_cAttempts);
      printf("  Resh= %4d",(ulong)(uint)s_cReshapes);
      printf("  NoResh= %4d",(ulong)(uint)(s_cAttempts - s_cReshapes));
      printf("  Cubes= %3d",(ulong)(uint)g_CoverInfo.nCubesInUse);
      printf("  (%d)",(ulong)(uint)(s_nCubesBefore - g_CoverInfo.nCubesInUse));
      uVar2 = CountLiterals();
      printf("  Lits= %5d",(ulong)uVar2);
      uVar2 = CountQCost();
      printf("  QCost = %6d",(ulong)uVar2);
      putchar(10);
    }
    return s_nCubesBefore - g_CoverInfo.nCubesInUse;
  }
  s_cAttempts = s_cAttempts + 1;
  iVar1 = ExorLinkCubeIteratorStart(s_CubeGroup,s_pC1,s_pC2,s_Dist);
  if (iVar1 != 0) {
    CubeExtract(s_pC1);
    CubeExtract(s_pC2);
    s_Que[0].PosMark = s_Que[0].PosIn;
    s_Que[1].PosMark = s_Que[1].PosIn;
    s_Que[2].PosMark = s_Que[2].PosIn;
    s_GroupCounter = 0;
    uVar5 = 0;
LAB_0034ff3c:
    while (s_CubeGroup[uVar5]->fMark != '\0') {
LAB_0034ff45:
      uVar5 = uVar5 + 1;
      if (uVar5 == 3) goto LAB_0034fff5;
    }
    iVar1 = CheckForCloseCubes(s_CubeGroup[uVar5],0);
    if (iVar1 == 0) {
      s_CubeGroup[uVar5]->fMark = '\x01';
      goto LAB_0034ff45;
    }
    if ((iVar1 == 1) && (s_fDecreaseLiterals != 0)) {
      if (g_CoverInfo.fUseQCost == 0) {
        iVar3 = (int)s_CubeGroup[2]->a + (int)s_CubeGroup[1]->a + (int)s_CubeGroup[0]->a;
        iVar1 = (int)s_pC2->a + (int)s_pC1->a + s_ChangeStore_2;
      }
      else {
        iVar3 = (int)s_CubeGroup[2]->q + (int)s_CubeGroup[1]->q + (int)s_CubeGroup[0]->q;
        iVar1 = (int)s_pC2->q + (int)s_pC1->q + s_ChangeStore_4;
      }
      if (iVar3 <= iVar1) goto LAB_00350056;
      UndoRecentChanges();
      goto LAB_0034fff5;
    }
LAB_00350056:
    lVar4 = 0;
    do {
      if ((uVar5 & 0xffffffff) << 3 != lVar4) {
        CheckForCloseCubes(*(Cube **)((long)s_CubeGroup + lVar4),1);
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    ExorLinkCubeIteratorCleanUp(1);
    AddToFreeCubes(s_pC1);
    AddToFreeCubes(s_pC2);
    s_cReshapes = s_cReshapes + 1;
  }
  goto LAB_003500a5;
LAB_0034fff5:
  s_GroupCounter = s_GroupCounter + 1;
  s_Que[0].PosIn = s_Que[0].PosMark;
  s_Que[1].PosIn = s_Que[1].PosMark;
  s_Que[2].PosIn = s_Que[2].PosMark;
  iVar1 = ExorLinkCubeIteratorNext(s_CubeGroup);
  uVar5 = 0;
  if (iVar1 == 0) goto code_r0x00350035;
  goto LAB_0034ff3c;
code_r0x00350035:
  CubeInsert(s_pC1);
  CubeInsert(s_pC2);
  ExorLinkCubeIteratorCleanUp(0);
LAB_003500a5:
  iVar1 = IteratorCubePairNext();
  goto joined_r0x0034febc;
}

Assistant:

int IterativelyApplyExorLink3( char fDistEnable )   
{
    int z, c, d;
    // this var is specific to ExorLink-3
    s_Dist = (cubedist)1;

    // enable pair accumulation
    s_fDistEnable2 = fDistEnable & 1;
    s_fDistEnable3 = fDistEnable & 2;
    s_fDistEnable4 = fDistEnable & 4;

    // initialize counters
    s_cEnquequed = GetQuequeStats( s_Dist );
    s_cAttempts  = 0;
    s_cReshapes  = 0;

    // remember the number of cubes before minimization
    s_nCubesBefore = g_CoverInfo.nCubesInUse;

    for ( z = IteratorCubePairStart( s_Dist, &s_pC1, &s_pC2 ); z; z = IteratorCubePairNext() )
    {
        s_cAttempts++;
        // start ExorLink of the given Distance
        if ( ExorLinkCubeIteratorStart( s_CubeGroup, s_pC1, s_pC2, s_Dist ) )
        {
            // extract old cubes from storage (to prevent EXORing with their derivitives)
            CubeExtract( s_pC1 );
            CubeExtract( s_pC2 );

            // mark the current position in the cube pair queques
            MarkSet();

            // check cube groups one by one
            s_GroupCounter = 0;
            do  
            {   // check the cubes of this group one by one
                for ( c = 0; c < 3; c++ )
                if ( !s_CubeGroup[c]->fMark ) // this cube has not yet been checked
                {
                    s_Gain = CheckForCloseCubes( s_CubeGroup[c], 0 ); // do not insert the cube, by default
                    if ( s_Gain ) 
                    { // this cube leads to improvement or reshaping - it is already inserted

                        // decide whether to accept this group based on literal count
                        if ( s_fDecreaseLiterals && s_Gain == 1 )
                        if ( g_CoverInfo.fUseQCost ?
                             s_CubeGroup[0]->q + s_CubeGroup[1]->q + s_CubeGroup[2]->q > s_pC1->q + s_pC2->q + s_ChangeStore.PrevQq :
                             s_CubeGroup[0]->a + s_CubeGroup[1]->a + s_CubeGroup[2]->a > s_pC1->a + s_pC2->a + s_ChangeStore.PrevQa 
                           ) // the group increases literals
                        { // do not take this group
                            // remember the group
                            s_GroupBest = s_GroupCounter;
                            // undo changes to be able to continue checking other groups
                            UndoRecentChanges();
                            break;
                        }

                        // take this group
                        for ( d = 0; d < 3; d++ ) // insert other cubes
                            if ( d != c )
                            {
                                CheckForCloseCubes( s_CubeGroup[d], 1 ); 
//                              if ( s_CubeGroup[d]->fMark )
//                                  CheckAndInsert( s_CubeGroup[d] );
//                                  CheckOnlyOneCube( s_CubeGroup[d] );
//                                  CheckForCloseCubes( s_CubeGroup[d], 1 ); 
//                              else
//                                  CheckForCloseCubes( s_CubeGroup[d], 1 ); 
                            }

                        // clean the results of generating ExorLinked cubes
                        ExorLinkCubeIteratorCleanUp( 1 ); // take the last group
                        // free old cubes
                        AddToFreeCubes( s_pC1 );
                        AddToFreeCubes( s_pC2 );
                        // update the counter
                        s_cReshapes++;
                        goto END_OF_LOOP;
                    }
                    else // mark the cube as checked
                        s_CubeGroup[c]->fMark = 1;
                }
                // the group is not taken - find the new group
                s_GroupCounter++;
                                        
                // rewind to the previously marked position in the cube pair queques
                MarkRewind();
            } 
            while ( ExorLinkCubeIteratorNext( s_CubeGroup ) );
            // none of the groups leads to improvement

            // return the old cubes back to storage
            CubeInsert( s_pC1 );
            CubeInsert( s_pC2 );
            // clean the results of generating ExorLinked cubes
            ExorLinkCubeIteratorCleanUp( 0 );
        }
END_OF_LOOP: {}
    }

    // print the report
    if ( g_CoverInfo.Verbosity == 2 )
    {
    printf( "ExLink-%d", 3 );
    printf( ": Que= %5d", s_cEnquequed );
    printf( "  Att= %4d", s_cAttempts );
    printf( "  Resh= %4d", s_cReshapes );
    printf( "  NoResh= %4d", s_cAttempts - s_cReshapes );
    printf( "  Cubes= %3d", g_CoverInfo.nCubesInUse );
    printf( "  (%d)", s_nCubesBefore - g_CoverInfo.nCubesInUse );
    printf( "  Lits= %5d", CountLiterals() );
    printf( "  QCost = %6d", CountQCost() );
    printf( "\n" );
    }

    // return the number of cubes gained in the process
    return s_nCubesBefore - g_CoverInfo.nCubesInUse;
}